

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O0

void __thiscall arangodb::velocypack::HexDump::~HexDump(HexDump *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

HexDump(Slice slice, int valuesPerLine = 16,
          std::string const& separator = " ", std::string const& header = "0x")
      : data(slice.start()),
        length(slice.byteSize()),
        valuesPerLine(valuesPerLine),
        separator(separator),
        header(header) {}